

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

mg_str * mg_get_http_header(http_message *hm,char *name)

{
  int iVar1;
  size_t len;
  size_t sVar2;
  mg_str *pmVar3;
  
  len = strlen(name);
  sVar2 = hm->header_names[0].len;
  if (sVar2 != 0) {
    pmVar3 = hm->header_values;
    do {
      if ((sVar2 == len && pmVar3[-0x28].p != (char *)0x0) &&
         (iVar1 = mg_ncasecmp(pmVar3[-0x28].p,name,len), iVar1 == 0)) {
        return pmVar3;
      }
      sVar2 = pmVar3[-0x27].len;
      pmVar3 = pmVar3 + 1;
    } while (sVar2 != 0);
  }
  return (mg_str *)0x0;
}

Assistant:

struct mg_str *mg_get_http_header(struct http_message *hm, const char *name) {
    size_t i, len = strlen(name);

    for (i = 0; hm->header_names[i].len > 0; i++) {
        struct mg_str *h = &hm->header_names[i], *v = &hm->header_values[i];
        if (h->p != NULL && h->len == len && !mg_ncasecmp(h->p, name, len))
            return v;
    }

    return NULL;
}